

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialog.cpp
# Opt level: O3

void __thiscall Dialog::BuildPacket(Dialog *this,PacketBuilder *builder)

{
  _Elt_pointer pbVar1;
  pointer pcVar2;
  int iVar3;
  _Base_ptr p_Var4;
  _Elt_pointer pbVar5;
  _Elt_pointer pbVar6;
  _Rb_tree_header *p_Var7;
  _Map_pointer ppbVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> page;
  undefined1 local_60 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  Dialog *local_38;
  
  iVar3 = PacketLength(this);
  PacketBuilder::ReserveMore(builder,(long)iVar3);
  pbVar6 = (this->pages).
           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  pbVar1 = (this->pages).
           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  local_38 = this;
  if (pbVar6 != pbVar1) {
    pbVar5 = (this->pages).
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last;
    ppbVar8 = (this->pages).
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node;
    do {
      local_60._0_8_ = &local_50;
      pcVar2 = (pbVar6->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_60,pcVar2,pcVar2 + pbVar6->_M_string_length);
      PacketBuilder::AddShort(builder,1);
      PacketBuilder::AddBreakString(builder,(string *)local_60,0xff);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._0_8_ != &local_50) {
        operator_delete((void *)local_60._0_8_,local_50._M_allocated_capacity + 1);
      }
      pbVar6 = pbVar6 + 1;
      if (pbVar6 == pbVar5) {
        pbVar6 = ppbVar8[1];
        ppbVar8 = ppbVar8 + 1;
        pbVar5 = pbVar6 + 0x10;
      }
    } while (pbVar6 != pbVar1);
  }
  p_Var4 = (local_38->links)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var7 = &(local_38->links)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var4 != p_Var7) {
    do {
      local_60._0_4_ = p_Var4[1]._M_color;
      local_60._8_8_ = local_50._M_local_buf + 8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_60 + 8),p_Var4[1]._M_parent,
                 (long)&(p_Var4[1]._M_parent)->_M_color + (long)&(p_Var4[1]._M_left)->_M_color);
      PacketBuilder::AddShort(builder,2);
      PacketBuilder::AddShort(builder,local_60._0_4_);
      PacketBuilder::AddBreakString(builder,(string *)(local_60 + 8),0xff);
      if ((char *)local_60._8_8_ != local_50._M_local_buf + 8) {
        operator_delete((void *)local_60._8_8_,local_50._8_8_ + 1);
      }
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var7);
  }
  return;
}

Assistant:

void Dialog::BuildPacket(PacketBuilder& builder) const
{
	builder.ReserveMore(this->PacketLength());

	UTIL_FOREACH(this->pages, page)
	{
		builder.AddShort(DIALOG_TEXT);
		builder.AddBreakString(page);
	}

	UTIL_FOREACH(this->links, link)
	{
		builder.AddShort(DIALOG_LINK);
		builder.AddShort(link.first);
		builder.AddBreakString(link.second);
	}
}